

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O3

SinkResultType __thiscall
duckdb::PhysicalCopyToFile::Sink
          (PhysicalCopyToFile *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
  *this_00;
  CopyToFunctionGlobalState *this_01;
  CopyToFunctionLocalState *this_02;
  GlobalSinkState *global_state;
  _Head_base<0UL,_duckdb::GlobalFunctionData_*,_false> _Var1;
  copy_to_sink_t p_Var2;
  undefined8 uVar3;
  char cVar4;
  ClientContext *pCVar5;
  type pFVar6;
  type pGVar7;
  type pGVar8;
  type pLVar9;
  undefined1 local_70 [16];
  _Any_data local_60;
  pointer local_50;
  code *local_48;
  ClientContext *local_40;
  pointer local_38;
  
  this_01 = (CopyToFunctionGlobalState *)input->global_state;
  this_02 = (CopyToFunctionLocalState *)input->local_state;
  if (this->write_empty_file == false) {
    CopyToFunctionGlobalState::Initialize(this_01,context->client,this);
  }
  this_02->total_rows_copied = this_02->total_rows_copied + chunk->count;
  if (this->partition_output == true) {
    CopyToFunctionLocalState::AppendToPartition(this_02,context,this,this_01,chunk);
    return NEED_MORE_INPUT;
  }
  if (this->per_thread_output != true) {
    if (((this->file_size_bytes).index == 0xffffffffffffffff) && (this->rotate == false)) {
      p_Var2 = (this->function).copy_to_sink;
      pFVar6 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
               operator*(&this->bind_data);
      pGVar7 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
               ::operator*(&this_01->global_state);
      pLVar9 = unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
               ::operator*(&this_02->local_state);
      (*p_Var2)(context,pFVar6,pGVar7,pLVar9,chunk);
      return NEED_MORE_INPUT;
    }
    global_state = input->global_state;
    local_60._8_8_ = 0;
    local_60._M_unused._M_object = operator_new(0x20);
    *(PhysicalCopyToFile **)local_60._M_unused._0_8_ = this;
    *(ExecutionContext **)((long)local_60._M_unused._0_8_ + 8) = context;
    *(CopyToFunctionLocalState **)((long)local_60._M_unused._0_8_ + 0x10) = this_02;
    *(DataChunk **)((long)local_60._M_unused._0_8_ + 0x18) = chunk;
    local_48 = ::std::
               _Function_handler<void_(duckdb::GlobalFunctionData_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/execution/operator/persistent/physical_copy_to_file.cpp:551:51)>
               ::_M_invoke;
    local_50 = (pointer)::std::
                        _Function_handler<void_(duckdb::GlobalFunctionData_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/execution/operator/persistent/physical_copy_to_file.cpp:551:51)>
                        ::_M_manager;
    WriteRotateInternal(this,context,global_state,
                        (function<void_(duckdb::GlobalFunctionData_&)> *)&local_60);
    if (local_50 == (pointer)0x0) {
      return NEED_MORE_INPUT;
    }
    (*(code *)local_50)(&local_60,&local_60,3);
    return NEED_MORE_INPUT;
  }
  this_00 = &this_02->global_state;
  if ((this_02->global_state).
      super_unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
      .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl ==
      (GlobalFunctionData *)0x0) {
    StorageLock::GetExclusiveLock((StorageLock *)&local_60);
    pCVar5 = context->client;
    pGVar8 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator*(&(this->super_PhysicalOperator).sink_state);
    unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::operator*
              ((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
                *)&local_60);
    CreateFileState((PhysicalCopyToFile *)local_70,(ClientContext *)this,(GlobalSinkState *)pCVar5,
                    (StorageLockKey *)pGVar8);
  }
  else {
    if (this->rotate != true) goto LAB_016c2ccd;
    local_70._8_8_ = (this->function).rotate_next_file;
    pCVar5 = (ClientContext *)
             unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
             ::operator*(this_00);
    local_38 = (pointer)&this->bind_data;
    pFVar6 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator*((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                        *)local_38);
    cVar4 = (*(code *)local_70._8_8_)(pCVar5,pFVar6,(GlobalFunctionData *)&this->file_size_bytes);
    if (cVar4 == '\0') goto LAB_016c2ccd;
    local_70._8_8_ = (this->function).copy_to_finalize;
    local_40 = context->client;
    pFVar6 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator*((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                        *)local_38);
    pGVar7 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
             ::operator*(this_00);
    (*(code *)local_70._8_8_)(local_40,pFVar6,pGVar7);
    StorageLock::GetExclusiveLock((StorageLock *)&local_60);
    pCVar5 = context->client;
    pGVar8 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator*(&(this->super_PhysicalOperator).sink_state);
    unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::operator*
              ((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
                *)&local_60);
    CreateFileState((PhysicalCopyToFile *)local_70,(ClientContext *)this,(GlobalSinkState *)pCVar5,
                    (StorageLockKey *)pGVar8);
  }
  uVar3 = local_70._0_8_;
  local_70._0_8_ = (GlobalFunctionData *)0x0;
  _Var1._M_head_impl =
       (this_00->
       super_unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
       .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl;
  (this_00->
  super_unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>).
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
  .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl =
       (GlobalFunctionData *)uVar3;
  if ((_Var1._M_head_impl != (GlobalFunctionData *)0x0) &&
     ((*(_Var1._M_head_impl)->_vptr_GlobalFunctionData[1])(),
     (GlobalFunctionData *)local_70._0_8_ != (GlobalFunctionData *)0x0)) {
    (*(*(_func_int ***)local_70._0_8_)[1])();
  }
  if ((StorageLockKey *)local_60._M_unused._0_8_ != (StorageLockKey *)0x0) {
    StorageLockKey::~StorageLockKey((StorageLockKey *)local_60._M_unused._0_8_);
    operator_delete(local_60._M_unused._M_object);
  }
LAB_016c2ccd:
  p_Var2 = (this->function).copy_to_sink;
  pFVar6 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator*(&this->bind_data);
  pGVar7 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
           ::operator*(this_00);
  pLVar9 = unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
           ::operator*(&this_02->local_state);
  (*p_Var2)(context,pFVar6,pGVar7,pLVar9,chunk);
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalCopyToFile::Sink(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input) const {
	auto &g = input.global_state.Cast<CopyToFunctionGlobalState>();
	auto &l = input.local_state.Cast<CopyToFunctionLocalState>();

	if (!write_empty_file) {
		// if we are only writing the file when there are rows to write we need to initialize here
		g.Initialize(context.client, *this);
	}
	l.total_rows_copied += chunk.size();

	if (partition_output) {
		l.AppendToPartition(context, *this, g, chunk);
		return SinkResultType::NEED_MORE_INPUT;
	}

	if (per_thread_output) {
		auto &gstate = l.global_state;
		if (!gstate) {
			// Lazily create file state here to prevent creating empty files
			auto global_lock = g.lock.GetExclusiveLock();
			gstate = CreateFileState(context.client, *sink_state, *global_lock);
		} else if (rotate && function.rotate_next_file(*gstate, *bind_data, file_size_bytes)) {
			function.copy_to_finalize(context.client, *bind_data, *gstate);
			auto global_lock = g.lock.GetExclusiveLock();
			gstate = CreateFileState(context.client, *sink_state, *global_lock);
		}
		function.copy_to_sink(context, *bind_data, *gstate, *l.local_state, chunk);
		return SinkResultType::NEED_MORE_INPUT;
	}

	if (!file_size_bytes.IsValid() && !rotate) {
		function.copy_to_sink(context, *bind_data, *g.global_state, *l.local_state, chunk);
		return SinkResultType::NEED_MORE_INPUT;
	}

	WriteRotateInternal(context, input.global_state, [&](GlobalFunctionData &gstate) {
		function.copy_to_sink(context, *bind_data, gstate, *l.local_state, chunk);
	});

	return SinkResultType::NEED_MORE_INPUT;
}